

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * index2adr_stack(lua_State *L,int idx)

{
  TValue *o;
  int idx_local;
  lua_State *L_local;
  TValue *local_8;
  
  if (idx < 1) {
    local_8 = L->top + idx;
  }
  else {
    local_8 = L->base + (idx + -1);
    if (L->top <= local_8) {
      local_8 = (TValue *)((ulong)(L->glref).ptr32 + 0x130);
    }
  }
  return local_8;
}

Assistant:

static TValue *index2adr_stack(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    if (o < L->top) {
      return o;
    } else {
      lj_checkapi(0, "invalid stack slot %d", idx);
      return niltv(L);
    }
    return o < L->top ? o : niltv(L);
  } else {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"invalid stack slot %d", idx);
    return L->top + idx;
  }
}